

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::read_file(string *path,string *out)

{
  ulong uVar1;
  long lVar2;
  ulong in_RSI;
  string *in_RDI;
  pos_type size;
  ifstream fs;
  streamoff in_stack_fffffffffffffd78;
  fpos<__mbstate_t> *in_stack_fffffffffffffd80;
  undefined8 local_248;
  undefined8 local_240;
  fpos local_238 [32];
  char local_218 [520];
  ulong local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218,in_RDI,_S_bin);
  std::istream::seekg((long)local_218,_S_beg);
  local_238._0_16_ = std::istream::tellg();
  std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::istream::seekg(local_218,local_248,local_240);
  uVar1 = local_10;
  std::fpos::operator_cast_to_long(local_238);
  std::__cxx11::string::resize(uVar1);
  lVar2 = std::__cxx11::string::operator[](local_10);
  std::fpos::operator_cast_to_long(local_238);
  std::istream::read(local_218,lVar2);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

inline void read_file(const std::string &path, std::string &out) {
  std::ifstream fs(path, std::ios_base::binary);
  fs.seekg(0, std::ios_base::end);
  auto size = fs.tellg();
  fs.seekg(0);
  out.resize(static_cast<size_t>(size));
  fs.read(&out[0], size);
}